

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O2

void __thiscall fizplex::Simplex::Simplex(Simplex *this,LP *_lp,int print_level_)

{
  size_t sVar1;
  size_t sVar2;
  ulong local_40;
  DVector *local_38;
  
  this->lp = _lp;
  this->print_level = print_level_;
  (this->basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->non_basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->non_basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->non_basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = ColMatrix::col_count(&_lp->A);
  sVar2 = ColMatrix::row_count(&this->lp->A);
  DVector::DVector(&this->x,sVar2 + sVar1);
  local_38 = &this->x;
  sVar1 = ColMatrix::col_count(&this->lp->A);
  sVar2 = ColMatrix::row_count(&this->lp->A);
  DVector::DVector(&this->c,sVar2 + sVar1);
  this->z = INFINITY;
  this->result = Unsolved;
  this->phase = One;
  sVar1 = ColMatrix::col_count(&this->lp->A);
  LP::add_logicals(this->lp);
  for (local_40 = 0; local_40 < sVar1; local_40 = local_40 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->non_basic_indices,&local_40);
  }
  while( true ) {
    local_40 = sVar1;
    sVar2 = ColMatrix::col_count(&this->lp->A);
    if (sVar2 <= sVar1) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->basic_indices,&local_40);
    sVar1 = local_40 + 1;
  }
  return;
}

Assistant:

Simplex::Simplex(LP &_lp, int print_level_)
    : lp(_lp), print_level(print_level_),
      x(lp.A.col_count() + lp.A.row_count()),
      c(lp.A.col_count() + lp.A.row_count()) {
  const size_t structural_count = lp.A.col_count();
  lp.add_logicals();
  for (size_t i = 0; i < structural_count; i++)
    non_basic_indices.push_back(i);
  for (size_t i = structural_count; i < lp.A.col_count(); i++)
    basic_indices.push_back(i);
}